

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,string *label,
          uint32_t prediction,size_t num_features,bool progress_add,float progress_arg)

{
  ostream *poVar1;
  string local_1c8;
  ostringstream pred_buf;
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pred_buf);
  *(undefined8 *)((long)&uStack_198 + *(long *)(_pred_buf + -0x18)) = 8;
  *(uint *)((long)auStack_190 + *(long *)(_pred_buf + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_pred_buf + -0x18)) & 0xffffff4f | 0x80;
  poVar1 = std::operator<<((ostringstream *)&pred_buf,0x20);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  print_update(this,holdout_set_off,current_pass,label,&local_1c8,num_features,progress_add,
               progress_arg);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pred_buf);
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, const std::string& label, uint32_t prediction,
      size_t num_features, bool progress_add, float progress_arg)
  {
    std::ostringstream pred_buf;

    pred_buf << std::setw(col_current_predict) << std::right << std::setfill(' ') << prediction;

    print_update(holdout_set_off, current_pass, label, pred_buf.str(), num_features, progress_add, progress_arg);
  }